

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymz280b.c
# Opt level: O1

UINT8 device_start_ymz280b(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  UINT8 UVar1;
  DEV_DATA DVar2;
  int *piVar3;
  void *pvVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  ymz280b_state *chip;
  void *pvVar10;
  
  DVar2.chipInf = calloc(1,0x2e8);
  if ((DEV_DATA *)DVar2.chipInf == (DEV_DATA *)0x0) {
    UVar1 = 0xff;
  }
  else {
    if (lookup_init == '\0') {
      piVar3 = diff_lookup;
      uVar6 = 0;
      uVar7 = 0;
      do {
        iVar8 = (uVar6 & 0xe) + 1;
        iVar9 = -iVar8;
        if (uVar7 < 8) {
          iVar9 = iVar8;
        }
        *piVar3 = iVar9;
        uVar7 = uVar7 + 1;
        piVar3 = piVar3 + 1;
        uVar6 = uVar6 + 2;
      } while (uVar7 != 0x10);
      lookup_init = '\x01';
    }
    pvVar10 = (void *)((double)cfg->clock / 384.0);
    ((DEV_DATA *)((long)DVar2.chipInf + 0x2c0))->chipInf = pvVar10;
    ((DEV_DATA *)((long)DVar2.chipInf + 0x2c8))->chipInf =
         (void *)((double)pvVar10 + (double)pvVar10);
    *(undefined4 *)&((DEV_DATA *)((long)DVar2.chipInf + 0x2d8))->chipInf = 0;
    ((DEV_DATA *)((long)DVar2.chipInf + 0x2d0))->chipInf = (void *)0x0;
    pvVar4 = calloc(10000,2);
    ((DEV_DATA *)((long)DVar2.chipInf + 0x298))->chipInf = (void *)0x0;
    *(undefined8 *)((long)DVar2.chipInf + 0x2a0) = 0;
    ((DEV_DATA *)((long)DVar2.chipInf + 0x2a8))->chipInf = (void *)0x0;
    *(undefined8 *)((long)DVar2.chipInf + 0x2b0) = 0;
    ((DEV_DATA *)((long)DVar2.chipInf + 0x2b8))->chipInf = (void *)0x0;
    ((DEV_DATA *)((long)DVar2.chipInf + 0x2e0))->chipInf = pvVar4;
    lVar5 = 0x69;
    do {
      *(undefined1 *)((long)DVar2.chipInf + lVar5) = 0;
      lVar5 = lVar5 + 0x4c;
    } while (lVar5 != 0x2c9);
    *(void **)DVar2.chipInf = DVar2.chipInf;
    retDevInf->dataPtr = (DEV_DATA *)DVar2.chipInf;
    retDevInf->sampleRate = (UINT32)(long)((double)pvVar10 + (double)pvVar10);
    retDevInf->devDef = &devDef;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
    UVar1 = '\0';
  }
  return UVar1;
}

Assistant:

static UINT8 device_start_ymz280b(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	ymz280b_state *chip;

	chip = (ymz280b_state *)calloc(1, sizeof(ymz280b_state));
	if (chip == NULL)
		return 0xFF;

	/* compute ADPCM tables */
	compute_tables();

	/* initialize the rest of the structure */
	chip->master_clock = (double)cfg->clock / 384.0;
	chip->rate = chip->master_clock * 2.0;
	// disabled until the frequency calculation gets fixed
	//SRATE_CUSTOM_HIGHEST(cfg->srMode, chip->rate, cfg->smplRate);
	
	chip->mem_size = 0x00;
	chip->mem_base = NULL;
	chip->irq_handler = NULL;
	chip->irq_param = NULL;
	chip->ext_read_handler = NULL;
	chip->ext_write_handler = NULL;
	chip->ext_param = NULL;

	/* allocate memory */
	chip->scratch = (INT16*)calloc(MAX_SAMPLE_CHUNK, sizeof(INT16));

	ymz280b_set_mute_mask(chip, 0x00);

	chip->_devData.chipInf = chip;
	INIT_DEVINF(retDevInf, &chip->_devData, (UINT32)INTERNAL_SAMPLE_RATE, &devDef);

	return 0x00;
}